

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginMainMenuBar(void)

{
  float fVar1;
  bool bVar2;
  ImVec2 local_30;
  ImVec2 local_28;
  ImVec2 local_20;
  ImGuiContext *local_18;
  ImGuiContext *g;
  
  local_18 = GImGui;
  ImVec2::ImVec2(&local_20,0.0,0.0);
  SetNextWindowPos(&local_20,0);
  fVar1 = (local_18->Style).FramePadding.y;
  ImVec2::ImVec2(&local_28,(local_18->IO).DisplaySize.x,fVar1 + fVar1 + local_18->FontBaseSize);
  SetNextWindowSize(&local_28,0);
  PushStyleVar(2,0.0);
  ImVec2::ImVec2(&local_30,0.0,0.0);
  PushStyleVar(3,&local_30);
  bVar2 = Begin("##MainMenuBar",(bool *)0x0,0x50f);
  if ((bVar2) && (bVar2 = BeginMenuBar(), bVar2)) {
    (local_18->CurrentWindow->DC).MenuBarOffsetX =
         (local_18->Style).DisplaySafeAreaPadding.x + (local_18->CurrentWindow->DC).MenuBarOffsetX;
    g._7_1_ = true;
  }
  else {
    End();
    PopStyleVar(2);
    g._7_1_ = false;
  }
  return g._7_1_;
}

Assistant:

bool ImGui::BeginMainMenuBar()
{
    ImGuiContext& g = *GImGui;
    SetNextWindowPos(ImVec2(0.0f, 0.0f));
    SetNextWindowSize(ImVec2(g.IO.DisplaySize.x, g.FontBaseSize + g.Style.FramePadding.y * 2.0f));
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0,0));
    if (!Begin("##MainMenuBar", NULL, ImGuiWindowFlags_NoTitleBar|ImGuiWindowFlags_NoResize|ImGuiWindowFlags_NoMove|ImGuiWindowFlags_NoScrollbar|ImGuiWindowFlags_NoSavedSettings|ImGuiWindowFlags_MenuBar)
        || !BeginMenuBar())
    {
        End();
        PopStyleVar(2);
        return false;
    }
    g.CurrentWindow->DC.MenuBarOffsetX += g.Style.DisplaySafeAreaPadding.x;
    return true;
}